

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O0

ring_buffer_size_t
PaUtil_InitializeRingBuffer
          (PaUtilRingBuffer *rbuf,ring_buffer_size_t elementSizeBytes,
          ring_buffer_size_t elementCount,void *dataPtr)

{
  char *in_RCX;
  ulong in_RDX;
  ring_buffer_size_t in_RSI;
  PaUtilRingBuffer *in_RDI;
  ring_buffer_size_t local_8;
  
  if ((in_RDX - 1 & in_RDX) == 0) {
    in_RDI->bufferSize = in_RDX;
    in_RDI->buffer = in_RCX;
    PaUtil_FlushRingBuffer(in_RDI);
    in_RDI->bigMask = in_RDX * 2 + -1;
    in_RDI->smallMask = in_RDX - 1;
    in_RDI->elementSizeBytes = in_RSI;
    local_8 = 0;
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

ring_buffer_size_t PaUtil_InitializeRingBuffer( PaUtilRingBuffer *rbuf, ring_buffer_size_t elementSizeBytes, ring_buffer_size_t elementCount, void *dataPtr )
{
    if( ((elementCount-1) & elementCount) != 0) return -1; /* Not Power of two. */
    rbuf->bufferSize = elementCount;
    rbuf->buffer = (char *)dataPtr;
    PaUtil_FlushRingBuffer( rbuf );
    rbuf->bigMask = (elementCount*2)-1;
    rbuf->smallMask = (elementCount)-1;
    rbuf->elementSizeBytes = elementSizeBytes;
    return 0;
}